

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.c
# Opt level: O3

double UnifReal(double dLow,double dHigh,long nStream)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  
  if ((dLow == dHigh) && (!NAN(dLow) && !NAN(dHigh))) {
    return dLow;
  }
  lVar4 = 0;
  if ((ulong)nStream < 0x32) {
    lVar4 = nStream;
  }
  dVar5 = dLow;
  if (dLow <= dHigh) {
    dVar5 = dHigh;
    dHigh = dLow;
  }
  lVar1 = (Seed[lVar4].value % 0x1f31d) * 0x41a7;
  lVar3 = (Seed[lVar4].value / 0x1f31d) * -0xb14;
  lVar2 = lVar1 + lVar3;
  lVar1 = lVar1 + lVar3 + 0x7fffffff;
  if (-1 < lVar2) {
    lVar1 = lVar2;
  }
  Seed[lVar4].value = lVar1;
  return (dVar5 - dHigh) * ((double)lVar1 / 2147483647.0) + dHigh;
}

Assistant:

double
UnifReal(double dLow, double dHigh, long nStream)

/*
 * Returns a double uniformly distributed between dLow and dHigh,   
 * excluding the endpoints.  nStream is the random number stream.   
 * Stream 0 is used if nStream is not in the range 0..MAX_STREAM.
 */

{
    double          dTemp;

    if (nStream < 0 || nStream > MAX_STREAM)
        nStream = 0;
    if (dLow == dHigh)
        return (dLow);
    if (dLow > dHigh)
    {
        dTemp = dLow;
        dLow = dHigh;
        dHigh = dTemp;
    }
    Seed[nStream].value = NextRand(Seed[nStream].value);
    dTemp = ((double) Seed[nStream].value / dM) * (dHigh - dLow);
    return (dLow + dTemp);
}